

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall Constructor::printBody(Constructor *this,ostream *s,ParserWalker *walker)

{
  int iVar1;
  int iVar2;
  TripleSymbol *pTVar3;
  ConstructState *pCVar4;
  char *pcVar5;
  OperandSymbol *pOVar6;
  long lVar7;
  pointer pbVar8;
  long lVar9;
  ulong uVar10;
  
  iVar1 = this->flowthruindex;
  lVar9 = (long)iVar1;
  if (((lVar9 != -1) &&
      (pTVar3 = (this->operands).
                super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9]->triple, pTVar3 != (TripleSymbol *)0x0)) &&
     (lVar7 = __dynamic_cast(pTVar3,&TripleSymbol::typeinfo,&SubtableSymbol::typeinfo,0), lVar7 != 0
     )) {
    iVar2 = walker->depth;
    walker->depth = iVar2 + 1;
    walker->breadcrumb[iVar2] = iVar1 + 1;
    pCVar4 = (walker->point->resolve).
             super__Vector_base<ConstructState_*,_std::allocator<ConstructState_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
    walker->point = pCVar4;
    walker->breadcrumb[walker->depth] = 0;
    printBody(pCVar4->ct,s,walker);
    walker->point = walker->point->parent;
    walker->depth = walker->depth + -1;
    return;
  }
  iVar1 = this->firstwhitespace;
  if (iVar1 != -1) {
    uVar10 = (ulong)(iVar1 + 1);
    pbVar8 = (this->printpiece).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(this->printpiece).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      lVar9 = (long)iVar1 * 0x20 + 0x28;
      do {
        pcVar5 = *(char **)((long)pbVar8 + lVar9 + -8);
        if (*pcVar5 == '\n') {
          pOVar6 = (this->operands).
                   super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pcVar5[1] + -0x41];
          (**(code **)(*(long *)&(pOVar6->super_SpecificSymbol).super_TripleSymbol.
                                 super_SleighSymbol + 0x50))(pOVar6,s,walker);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,pcVar5,*(long *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9));
        }
        uVar10 = uVar10 + 1;
        pbVar8 = (this->printpiece).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x20;
      } while (uVar10 < (ulong)((long)(this->printpiece).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5
                               ));
    }
  }
  return;
}

Assistant:

void Constructor::printBody(ostream &s,ParserWalker &walker) const

{
  if (flowthruindex != -1) {
    SubtableSymbol *sym = dynamic_cast<SubtableSymbol *>(operands[flowthruindex]->getDefiningSymbol());
    if (sym != (SubtableSymbol *)0) {
      walker.pushOperand(flowthruindex);
      walker.getConstructor()->printBody(s,walker);
      walker.popOperand();
      return;
    }
  }
  if (firstwhitespace == -1) return; // Nothing to print after firstwhitespace
  for(int4 i=firstwhitespace+1;i<printpiece.size();++i) {
    if (printpiece[i][0]=='\n') {
      int4 index = printpiece[i][1]-'A';
      operands[index]->print(s,walker);
    }
    else
      s << printpiece[i];
  }
}